

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
* __thiscall embree::CoronaLoader::loadInstances(CoronaLoader *this,Ref<embree::XML> *xml)

{
  undefined8 uVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  long *plVar7;
  size_type sVar8;
  unsigned_long *puVar9;
  undefined8 *puVar10;
  runtime_error *prVar11;
  undefined8 *puVar12;
  long *in_RDX;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  *in_RDI;
  Ref<embree::XML> child;
  size_t i;
  avector<AffineSpace3fa> xfms;
  Ref<embree::SceneGraph::MaterialNode> material;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_> v;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_> *old_items;
  size_t i_2;
  size_t i_1;
  size_t new_size_alloced;
  char *in_stack_fffffffffffff978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff990;
  undefined1 *puVar13;
  OBJMaterial *in_stack_fffffffffffff998;
  ParseLocation *in_stack_fffffffffffffa28;
  XML *this_00;
  allocator *xml_00;
  CoronaLoader *in_stack_fffffffffffffa68;
  string local_528 [32];
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  long *local_4c0;
  XML *local_4b8;
  ulong local_4b0;
  undefined1 local_4a8 [8];
  ulong local_4a0;
  ulong local_498;
  void *local_490;
  undefined1 local_482;
  allocator local_481;
  string local_480 [32];
  long *local_460;
  undefined1 local_455;
  string local_428 [32];
  long *local_408;
  long *local_3f0;
  long *local_3e8;
  long *local_3e0;
  XML **local_3d0;
  long *local_3c0;
  long **local_3b8;
  long **local_3b0;
  long **local_3a8;
  long **local_3a0;
  long **local_390;
  XML **local_380;
  XML **local_378;
  XML **local_370;
  XML **local_368;
  undefined1 *local_360;
  const_reference local_358;
  XML **local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  ulong local_1c0;
  undefined1 *local_1b8;
  ulong local_1b0;
  void *local_1a8;
  Ref<embree::XML> *in_stack_fffffffffffffe60;
  CoronaLoader *in_stack_fffffffffffffe68;
  ulong local_180;
  ulong local_178;
  ulong local_168;
  ulong local_160;
  unsigned_long local_90 [2];
  ulong local_80;
  ulong local_78;
  undefined1 *local_70;
  ulong local_68;
  void *local_60;
  void *local_58;
  long local_50;
  long local_48;
  void *local_40;
  long local_38;
  void *local_30;
  void *local_28;
  long local_20;
  long local_18;
  void *local_10;
  long local_8;
  
  local_408 = in_RDX;
  bVar6 = std::operator!=(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  if (bVar6) {
    local_455 = 1;
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_3e0 = local_408;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffa28);
    std::operator+(in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980);
    std::runtime_error::runtime_error(prVar11,local_428);
    local_455 = 0;
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  plVar7 = (long *)SceneGraph::MaterialNode::operator_new(0x464b2d);
  local_482 = 1;
  xml_00 = &local_481;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"",xml_00);
  OBJMaterial::OBJMaterial(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  local_482 = 0;
  local_3b8 = &local_460;
  local_3c0 = plVar7;
  local_460 = plVar7;
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 0x10))();
  }
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  local_360 = local_4a8;
  local_4a0 = 0;
  local_498 = 0;
  local_490 = (void *)0x0;
  local_4b0 = 0;
  do {
    uVar2 = local_4b0;
    local_3e8 = local_408;
    sVar8 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                      ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                        *)(*local_408 + 0x80));
    if (sVar8 <= uVar2) {
      std::
      make_pair<embree::Ref<embree::SceneGraph::MaterialNode>&,embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>,embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>,16ul>>&>
                ((Ref<embree::SceneGraph::MaterialNode> *)in_stack_fffffffffffff988,
                 (vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>
                  *)in_stack_fffffffffffff980);
      puVar13 = local_4a8;
      for (local_1c0 = 0; local_1c0 < local_4a0; local_1c0 = local_1c0 + 1) {
      }
      local_1b0 = local_498;
      local_1a8 = local_490;
      local_2f0 = puVar13;
      local_1b8 = puVar13;
      alignedFree(in_stack_fffffffffffff978);
      *(undefined8 *)(puVar13 + 0x18) = 0;
      *(undefined8 *)(puVar13 + 0x10) = 0;
      *(undefined8 *)(puVar13 + 8) = 0;
      local_390 = &local_460;
      if (local_460 != (long *)0x0) {
        (**(code **)(*local_460 + 0x18))();
      }
      return in_RDI;
    }
    local_3f0 = local_408;
    local_358 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
                operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                            *)(*local_408 + 0x80),local_4b0);
    local_350 = &local_4b8;
    local_4b8 = local_358->ptr;
    if (local_4b8 != (XML *)0x0) {
      (*(local_4b8->super_RefCount)._vptr_RefCount[2])();
    }
    local_368 = &local_4b8;
    this_00 = local_4b8;
    bVar6 = std::operator==(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    if (bVar6) {
      loadMaterial(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      local_3a8 = &local_460;
      local_3b0 = &local_4c0;
      if (local_460 != (long *)0x0) {
        (**(code **)(*local_460 + 0x18))();
      }
      local_460 = *local_3b0;
      *local_3b0 = (long *)0x0;
      local_3a0 = &local_4c0;
      if (local_4c0 != (long *)0x0) {
        (**(code **)(*local_4c0 + 0x18))();
      }
    }
    else {
      local_370 = &local_4b8;
      bVar6 = std::operator==(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      if (!bVar6) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_378 = &local_4b8;
        ParseLocation::str_abi_cxx11_((ParseLocation *)this_00);
        std::operator+(in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980);
        local_380 = &local_4b8;
        std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        std::runtime_error::runtime_error(prVar11,local_528);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                (in_stack_fffffffffffffa68,(Ref<embree::XML> *)xml_00);
      uVar2 = local_4a0;
      local_2f8 = local_4a8;
      local_300 = &local_508;
      local_2b8 = &local_348;
      local_270 = &local_338;
      local_278 = &local_328;
      local_260 = &local_318;
      local_348 = local_508;
      uStack_340 = uStack_500;
      local_230 = &local_4f8;
      local_228 = &local_338;
      local_338 = local_4f8;
      uStack_330 = uStack_4f0;
      local_240 = &local_4e8;
      local_238 = &local_328;
      local_328 = local_4e8;
      uStack_320 = uStack_4e0;
      local_2b0 = &local_4d8;
      local_2a8 = &local_318;
      local_318 = local_4d8;
      uStack_310 = uStack_4d0;
      local_160 = local_4a0;
      local_78 = local_4a0 + 1;
      local_2c0 = local_300;
      local_2a0 = local_2b8;
      local_268 = local_2b8;
      local_250 = local_300;
      local_248 = local_2b8;
      local_220 = local_300;
      local_218 = local_2b8;
      local_70 = local_2f8;
      if (local_498 < local_78) {
        uVar4 = local_78;
        if (local_498 != 0) {
          local_80 = local_498;
          while (local_80 < local_78) {
            local_90[1] = 1;
            local_90[0] = local_80 << 1;
            puVar9 = std::max<unsigned_long>(local_90 + 1,local_90);
            local_80 = *puVar9;
          }
          local_68 = local_80;
          uVar4 = local_68;
        }
      }
      else {
        uVar4 = local_498;
      }
      local_68 = uVar4;
      uVar4 = local_68;
      pvVar3 = local_490;
      uVar5 = local_4a0;
      if (uVar2 < local_4a0) {
        for (; uVar5 = uVar2, local_160 < local_4a0; local_160 = local_160 + 1) {
        }
      }
      local_4a0 = uVar5;
      if (local_68 == local_498) {
        for (local_168 = local_4a0; local_168 < uVar2; local_168 = local_168 + 1) {
          local_30 = (void *)((long)local_490 + local_168 * 0x40);
          local_18 = (long)local_30 + 0x10;
          local_20 = (long)local_30 + 0x20;
          local_8 = (long)local_30 + 0x30;
          local_28 = local_30;
          local_10 = local_30;
        }
      }
      else {
        local_490 = alignedMalloc((size_t)in_stack_fffffffffffff988,
                                  (size_t)in_stack_fffffffffffff980);
        for (local_178 = 0; local_178 < local_4a0; local_178 = local_178 + 1) {
          puVar12 = (undefined8 *)((long)local_490 + local_178 * 0x40);
          puVar10 = (undefined8 *)((long)pvVar3 + local_178 * 0x40);
          uVar1 = puVar10[1];
          *puVar12 = *puVar10;
          puVar12[1] = uVar1;
          uVar1 = puVar10[3];
          puVar12[2] = puVar10[2];
          puVar12[3] = uVar1;
          uVar1 = puVar10[5];
          puVar12[4] = puVar10[4];
          puVar12[5] = uVar1;
          uVar1 = puVar10[7];
          puVar12[6] = puVar10[6];
          puVar12[7] = uVar1;
        }
        for (local_180 = local_4a0; local_180 < uVar2; local_180 = local_180 + 1) {
          local_60 = (void *)((long)local_490 + local_180 * 0x40);
          local_48 = (long)local_60 + 0x10;
          local_50 = (long)local_60 + 0x20;
          local_38 = (long)local_60 + 0x30;
          local_58 = local_60;
          local_40 = local_60;
        }
        alignedFree(in_stack_fffffffffffff978);
        local_498 = uVar4;
      }
      local_4a0 = uVar2 + 1;
      local_2d8 = (undefined8 *)((long)local_490 + uVar2 * 0x40);
      local_2e0 = &local_348;
      local_288 = local_2d8 + 2;
      local_290 = local_2d8 + 4;
      local_258 = local_2d8 + 6;
      *local_2d8 = local_348;
      local_2d8[1] = uStack_340;
      local_1f0 = &local_338;
      local_1e8 = local_2d8 + 2;
      *local_1e8 = local_338;
      local_2d8[3] = uStack_330;
      local_200 = &local_328;
      local_1f8 = local_2d8 + 4;
      *local_1f8 = local_328;
      local_2d8[5] = uStack_320;
      local_2d0 = &local_318;
      local_2c8 = local_2d8 + 6;
      *(undefined4 *)local_2c8 = (undefined4)local_318;
      *(undefined4 *)((long)local_2d8 + 0x34) = local_318._4_4_;
      *(undefined4 *)(local_2d8 + 7) = (undefined4)uStack_310;
      *(undefined4 *)((long)local_2d8 + 0x3c) = uStack_310._4_4_;
      local_298 = local_2d8;
      local_280 = local_2d8;
      local_210 = local_2e0;
      local_208 = local_2d8;
      local_1e0 = local_2e0;
      local_1d8 = local_2d8;
    }
    local_3d0 = &local_4b8;
    if (local_4b8 != (XML *)0x0) {
      (*(local_4b8->super_RefCount)._vptr_RefCount[3])();
    }
    local_4b0 = local_4b0 + 1;
  } while( true );
}

Assistant:

std::pair<Ref<SceneGraph::MaterialNode>, avector<AffineSpace3fa> > CoronaLoader::loadInstances(const Ref<XML>& xml) 
  {
    if (xml->name != "instance") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid instance node");

    /* create default material */
    Ref<SceneGraph::MaterialNode> material = new OBJMaterial;

    avector<AffineSpace3fa> xfms;
    for (size_t i=0; i<xml->children.size(); i++)
    {
      Ref<XML> child = xml->children[i];
      if      (child->name == "material" ) material = loadMaterial(child);
      else if (child->name == "transform") xfms.push_back(load<AffineSpace3fa>(child));
      else THROW_RUNTIME_ERROR(child->loc.str()+": unknown node: "+child->name);
    }

    return std::make_pair(material,xfms);
  }